

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_roundingutils.h
# Opt level: O0

bool icu_63::number::impl::roundingutils::getRoundingDirection
               (bool isEven,bool isNegative,Section section,RoundingMode roundingMode,
               UErrorCode *status)

{
  UErrorCode *status_local;
  RoundingMode roundingMode_local;
  Section section_local;
  bool isNegative_local;
  bool isEven_local;
  
  switch(roundingMode) {
  case UNUM_ROUND_CEILING:
    return isNegative;
  case UNUM_ROUND_FLOOR:
    return (bool)((isNegative ^ 0xffU) & 1);
  case UNUM_ROUND_DOWN:
    return true;
  case UNUM_ROUND_UP:
    return false;
  case UNUM_FOUND_HALFEVEN:
    if (section == SECTION_LOWER) {
      return true;
    }
    if (section == SECTION_MIDPOINT) {
      return isEven;
    }
    if (section == SECTION_UPPER) {
      return false;
    }
    break;
  case UNUM_ROUND_HALFDOWN:
    if (section == SECTION_LOWER) {
      return true;
    }
    if (section == SECTION_MIDPOINT) {
      return true;
    }
    if (section == SECTION_UPPER) {
      return false;
    }
    break;
  case UNUM_ROUND_HALFUP:
    if (section == SECTION_LOWER) {
      return true;
    }
    if (section == SECTION_MIDPOINT) {
      return false;
    }
    if (section == SECTION_UPPER) {
      return false;
    }
  }
  *status = U_FORMAT_INEXACT_ERROR;
  return false;
}

Assistant:

inline bool
getRoundingDirection(bool isEven, bool isNegative, Section section, RoundingMode roundingMode,
                     UErrorCode &status) {
    switch (roundingMode) {
        case RoundingMode::UNUM_ROUND_UP:
            // round away from zero
            return false;

        case RoundingMode::UNUM_ROUND_DOWN:
            // round toward zero
            return true;

        case RoundingMode::UNUM_ROUND_CEILING:
            // round toward positive infinity
            return isNegative;

        case RoundingMode::UNUM_ROUND_FLOOR:
            // round toward negative infinity
            return !isNegative;

        case RoundingMode::UNUM_ROUND_HALFUP:
            switch (section) {
                case SECTION_MIDPOINT:
                    return false;
                case SECTION_LOWER:
                    return true;
                case SECTION_UPPER:
                    return false;
                default:
                    break;
            }
            break;

        case RoundingMode::UNUM_ROUND_HALFDOWN:
            switch (section) {
                case SECTION_MIDPOINT:
                    return true;
                case SECTION_LOWER:
                    return true;
                case SECTION_UPPER:
                    return false;
                default:
                    break;
            }
            break;

        case RoundingMode::UNUM_ROUND_HALFEVEN:
            switch (section) {
                case SECTION_MIDPOINT:
                    return isEven;
                case SECTION_LOWER:
                    return true;
                case SECTION_UPPER:
                    return false;
                default:
                    break;
            }
            break;

        default:
            break;
    }

    status = U_FORMAT_INEXACT_ERROR;
    return false;
}